

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O1

void __thiscall wasm::MultiMemoryLowering::Replacer::walkFunction(Replacer *this,Function *func)

{
  MultiMemoryLowering *pMVar1;
  pointer pNVar2;
  pointer pNVar3;
  char *pcVar4;
  bool bVar5;
  
  pMVar1 = this->parent;
  pNVar2 = (pMVar1->memorySizeNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pNVar3 = (pMVar1->memorySizeNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pNVar2 == pNVar3;
  if (!bVar5) {
    pcVar4 = (pNVar2->super_IString).str._M_str;
    while (pcVar4 != (func->super_Importable).super_Named.name.super_IString.str._M_str) {
      bVar5 = pNVar2 + 1 == pNVar3;
      if (bVar5) goto LAB_0099b7ae;
      pcVar4 = pNVar2[1].super_IString.str._M_str;
      pNVar2 = pNVar2 + 1;
    }
    if (!bVar5) {
      return;
    }
  }
LAB_0099b7ae:
  pNVar2 = (pMVar1->memoryGrowNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pNVar3 = (pMVar1->memoryGrowNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pNVar2 == pNVar3;
  if (!bVar5) {
    pcVar4 = (pNVar2->super_IString).str._M_str;
    while (pcVar4 != (func->super_Importable).super_Named.name.super_IString.str._M_str) {
      bVar5 = pNVar2 + 1 == pNVar3;
      if (bVar5) goto LAB_0099b7ee;
      pcVar4 = pNVar2[1].super_IString.str._M_str;
      pNVar2 = pNVar2 + 1;
    }
    if (!bVar5) {
      return;
    }
  }
LAB_0099b7ee:
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
  ).
  super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
  .
  super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
  .currFunction = func;
  Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
  ::walk(&(this->
          super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
          ).
          super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
          .
          super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
         ,&func->body);
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
  ).
  super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
  .
  super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
  .currFunction = (Function *)0x0;
  return;
}

Assistant:

void walkFunction(Function* func) {
      for (Name funcName : parent.memorySizeNames) {
        if (funcName == func->name) {
          return;
        }
      }
      for (Name funcName : parent.memoryGrowNames) {
        if (funcName == func->name) {
          return;
        }
      }
      Super::walkFunction(func);
    }